

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx_context.c
# Opt level: O0

void destroyContextGLX(_GLFWwindow *window)

{
  _GLFWwindow *window_local;
  
  if ((window->context).glx.window != 0) {
    (*_glfw.glx.DestroyWindow)(_glfw.x11.display,(window->context).glx.window);
    (window->context).glx.window = 0;
  }
  if ((window->context).glx.handle != (GLXContext)0x0) {
    (*_glfw.glx.DestroyContext)(_glfw.x11.display,(window->context).glx.handle);
    (window->context).glx.handle = (GLXContext)0x0;
  }
  return;
}

Assistant:

static void destroyContextGLX(_GLFWwindow* window)
{
    if (window->context.glx.window)
    {
        glXDestroyWindow(_glfw.x11.display, window->context.glx.window);
        window->context.glx.window = None;
    }

    if (window->context.glx.handle)
    {
        glXDestroyContext(_glfw.x11.display, window->context.glx.handle);
        window->context.glx.handle = NULL;
    }
}